

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapecube.cpp
# Opt level: O0

void pzshape::TPZShapeCube::ShapeGenerating
               (TPZVec<double> *pt,TPZVec<int> *nshape,TPZFMatrix<double> *phi,
               TPZFMatrix<double> *dphi)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  int *piVar6;
  double *pdVar7;
  int64_t iVar8;
  TPZVec<int> *in_RSI;
  int mult;
  int dim;
  int hs;
  int nh;
  int h;
  TPZStack<int,_10> highsides;
  int is2_2;
  int is1_2;
  int is2_1;
  int is1_1;
  int is2;
  int is1;
  int is;
  TPZStack<int,_10> *in_stack_fffffffffffffd38;
  double in_stack_fffffffffffffd40;
  undefined8 in_stack_fffffffffffffd48;
  TPZStack<int,_10> *in_stack_fffffffffffffd50;
  double *in_stack_fffffffffffffd58;
  TPZFMatrix<double> *in_stack_fffffffffffffd60;
  int local_27c;
  int local_278;
  int local_98;
  TPZVec<int> local_88 [2];
  undefined4 local_3c;
  undefined4 local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  TPZVec<int> *local_10;
  
  local_10 = in_RSI;
  for (local_24 = 8; local_24 < 0x14; local_24 = local_24 + 1) {
    piVar6 = TPZVec<int>::operator[](local_10,(long)(local_24 + -8));
    if (*piVar6 != 0) {
      local_28 = pztopology::TPZCube::ContainedSideLocId
                           ((int)in_stack_fffffffffffffd50,
                            (int)((ulong)in_stack_fffffffffffffd48 >> 0x20));
      local_2c = pztopology::TPZCube::ContainedSideLocId
                           ((int)in_stack_fffffffffffffd50,
                            (int)((ulong)in_stack_fffffffffffffd48 >> 0x20));
      pdVar7 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffd60,(int64_t)in_stack_fffffffffffffd58,
                          (int64_t)in_stack_fffffffffffffd50);
      dVar1 = *pdVar7;
      pdVar7 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffd60,(int64_t)in_stack_fffffffffffffd58,
                          (int64_t)in_stack_fffffffffffffd50);
      dVar2 = *pdVar7;
      pdVar7 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffd60,(int64_t)in_stack_fffffffffffffd58,
                          (int64_t)in_stack_fffffffffffffd50);
      *pdVar7 = dVar1 * dVar2;
      pdVar7 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffd60,(int64_t)in_stack_fffffffffffffd58,
                          (int64_t)in_stack_fffffffffffffd50);
      dVar1 = *pdVar7;
      pdVar7 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffd60,(int64_t)in_stack_fffffffffffffd58,
                          (int64_t)in_stack_fffffffffffffd50);
      dVar2 = *pdVar7;
      pdVar7 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffd60,(int64_t)in_stack_fffffffffffffd58,
                          (int64_t)in_stack_fffffffffffffd50);
      dVar3 = *pdVar7;
      pdVar7 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffd60,(int64_t)in_stack_fffffffffffffd58,
                          (int64_t)in_stack_fffffffffffffd50);
      dVar4 = *pdVar7;
      pdVar7 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffd60,(int64_t)in_stack_fffffffffffffd58,
                          (int64_t)in_stack_fffffffffffffd50);
      *pdVar7 = dVar1 * dVar2 + dVar3 * dVar4;
      pdVar7 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffd60,(int64_t)in_stack_fffffffffffffd58,
                          (int64_t)in_stack_fffffffffffffd50);
      dVar1 = *pdVar7;
      pdVar7 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffd60,(int64_t)in_stack_fffffffffffffd58,
                          (int64_t)in_stack_fffffffffffffd50);
      dVar2 = *pdVar7;
      pdVar7 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffd60,(int64_t)in_stack_fffffffffffffd58,
                          (int64_t)in_stack_fffffffffffffd50);
      dVar3 = *pdVar7;
      pdVar7 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffd60,(int64_t)in_stack_fffffffffffffd58,
                          (int64_t)in_stack_fffffffffffffd50);
      dVar4 = *pdVar7;
      pdVar7 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffd60,(int64_t)in_stack_fffffffffffffd58,
                          (int64_t)in_stack_fffffffffffffd50);
      *pdVar7 = dVar1 * dVar2 + dVar3 * dVar4;
      pdVar7 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffd60,(int64_t)in_stack_fffffffffffffd58,
                          (int64_t)in_stack_fffffffffffffd50);
      dVar1 = *pdVar7;
      pdVar7 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffd60,(int64_t)in_stack_fffffffffffffd58,
                          (int64_t)in_stack_fffffffffffffd50);
      dVar2 = *pdVar7;
      pdVar7 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffd60,(int64_t)in_stack_fffffffffffffd58,
                          (int64_t)in_stack_fffffffffffffd50);
      dVar3 = *pdVar7;
      pdVar7 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffd60,(int64_t)in_stack_fffffffffffffd58,
                          (int64_t)in_stack_fffffffffffffd50);
      dVar4 = *pdVar7;
      pdVar7 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffd60,(int64_t)in_stack_fffffffffffffd58,
                          (int64_t)in_stack_fffffffffffffd50);
      *pdVar7 = dVar1 * dVar2 + dVar3 * dVar4;
    }
  }
  for (local_24 = 0x14; local_24 < 0x1a; local_24 = local_24 + 1) {
    local_30 = pztopology::TPZCube::ContainedSideLocId
                         ((int)in_stack_fffffffffffffd50,
                          (int)((ulong)in_stack_fffffffffffffd48 >> 0x20));
    local_34 = pztopology::TPZCube::ContainedSideLocId
                         ((int)in_stack_fffffffffffffd50,
                          (int)((ulong)in_stack_fffffffffffffd48 >> 0x20));
    pdVar7 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd60,(int64_t)in_stack_fffffffffffffd58,
                        (int64_t)in_stack_fffffffffffffd50);
    dVar1 = *pdVar7;
    pdVar7 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd60,(int64_t)in_stack_fffffffffffffd58,
                        (int64_t)in_stack_fffffffffffffd50);
    dVar2 = *pdVar7;
    pdVar7 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd60,(int64_t)in_stack_fffffffffffffd58,
                        (int64_t)in_stack_fffffffffffffd50);
    *pdVar7 = dVar1 * dVar2;
    pdVar7 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd60,(int64_t)in_stack_fffffffffffffd58,
                        (int64_t)in_stack_fffffffffffffd50);
    dVar1 = *pdVar7;
    pdVar7 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd60,(int64_t)in_stack_fffffffffffffd58,
                        (int64_t)in_stack_fffffffffffffd50);
    dVar2 = *pdVar7;
    pdVar7 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd60,(int64_t)in_stack_fffffffffffffd58,
                        (int64_t)in_stack_fffffffffffffd50);
    dVar3 = *pdVar7;
    pdVar7 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd60,(int64_t)in_stack_fffffffffffffd58,
                        (int64_t)in_stack_fffffffffffffd50);
    dVar4 = *pdVar7;
    pdVar7 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd60,(int64_t)in_stack_fffffffffffffd58,
                        (int64_t)in_stack_fffffffffffffd50);
    *pdVar7 = dVar1 * dVar2 + dVar3 * dVar4;
    pdVar7 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd60,(int64_t)in_stack_fffffffffffffd58,
                        (int64_t)in_stack_fffffffffffffd50);
    dVar1 = *pdVar7;
    pdVar7 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd60,(int64_t)in_stack_fffffffffffffd58,
                        (int64_t)in_stack_fffffffffffffd50);
    dVar2 = *pdVar7;
    pdVar7 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd60,(int64_t)in_stack_fffffffffffffd58,
                        (int64_t)in_stack_fffffffffffffd50);
    dVar3 = *pdVar7;
    pdVar7 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd60,(int64_t)in_stack_fffffffffffffd58,
                        (int64_t)in_stack_fffffffffffffd50);
    dVar4 = *pdVar7;
    pdVar7 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd60,(int64_t)in_stack_fffffffffffffd58,
                        (int64_t)in_stack_fffffffffffffd50);
    *pdVar7 = dVar1 * dVar2 + dVar3 * dVar4;
    pdVar7 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd60,(int64_t)in_stack_fffffffffffffd58,
                        (int64_t)in_stack_fffffffffffffd50);
    dVar1 = *pdVar7;
    pdVar7 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd60,(int64_t)in_stack_fffffffffffffd58,
                        (int64_t)in_stack_fffffffffffffd50);
    dVar2 = *pdVar7;
    pdVar7 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd60,(int64_t)in_stack_fffffffffffffd58,
                        (int64_t)in_stack_fffffffffffffd50);
    dVar3 = *pdVar7;
    pdVar7 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd60,(int64_t)in_stack_fffffffffffffd58,
                        (int64_t)in_stack_fffffffffffffd50);
    dVar4 = *pdVar7;
    pdVar7 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd60,(int64_t)in_stack_fffffffffffffd58,
                        (int64_t)in_stack_fffffffffffffd50);
    *pdVar7 = dVar1 * dVar2 + dVar3 * dVar4;
  }
  for (local_24 = 0x1a; local_24 < 0x1b; local_24 = local_24 + 1) {
    local_38 = 0;
    local_3c = 6;
    pdVar7 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd60,(int64_t)in_stack_fffffffffffffd58,
                        (int64_t)in_stack_fffffffffffffd50);
    dVar1 = *pdVar7;
    pdVar7 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd60,(int64_t)in_stack_fffffffffffffd58,
                        (int64_t)in_stack_fffffffffffffd50);
    dVar2 = *pdVar7;
    pdVar7 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd60,(int64_t)in_stack_fffffffffffffd58,
                        (int64_t)in_stack_fffffffffffffd50);
    *pdVar7 = dVar1 * dVar2;
    pdVar7 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd60,(int64_t)in_stack_fffffffffffffd58,
                        (int64_t)in_stack_fffffffffffffd50);
    dVar1 = *pdVar7;
    pdVar7 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd60,(int64_t)in_stack_fffffffffffffd58,
                        (int64_t)in_stack_fffffffffffffd50);
    dVar2 = *pdVar7;
    pdVar7 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd60,(int64_t)in_stack_fffffffffffffd58,
                        (int64_t)in_stack_fffffffffffffd50);
    dVar3 = *pdVar7;
    pdVar7 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd60,(int64_t)in_stack_fffffffffffffd58,
                        (int64_t)in_stack_fffffffffffffd50);
    dVar4 = *pdVar7;
    pdVar7 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd60,(int64_t)in_stack_fffffffffffffd58,
                        (int64_t)in_stack_fffffffffffffd50);
    *pdVar7 = dVar1 * dVar2 + dVar3 * dVar4;
    pdVar7 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd60,(int64_t)in_stack_fffffffffffffd58,
                        (int64_t)in_stack_fffffffffffffd50);
    dVar1 = *pdVar7;
    pdVar7 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd60,(int64_t)in_stack_fffffffffffffd58,
                        (int64_t)in_stack_fffffffffffffd50);
    dVar2 = *pdVar7;
    pdVar7 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd60,(int64_t)in_stack_fffffffffffffd58,
                        (int64_t)in_stack_fffffffffffffd50);
    dVar3 = *pdVar7;
    pdVar7 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd60,(int64_t)in_stack_fffffffffffffd58,
                        (int64_t)in_stack_fffffffffffffd50);
    dVar4 = *pdVar7;
    pdVar7 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd60,(int64_t)in_stack_fffffffffffffd58,
                        (int64_t)in_stack_fffffffffffffd50);
    *pdVar7 = dVar1 * dVar2 + dVar3 * dVar4;
    pdVar7 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd60,(int64_t)in_stack_fffffffffffffd58,
                        (int64_t)in_stack_fffffffffffffd50);
    dVar1 = *pdVar7;
    pdVar7 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd60,(int64_t)in_stack_fffffffffffffd58,
                        (int64_t)in_stack_fffffffffffffd50);
    dVar2 = *pdVar7;
    pdVar7 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd60,(int64_t)in_stack_fffffffffffffd58,
                        (int64_t)in_stack_fffffffffffffd50);
    dVar3 = *pdVar7;
    pdVar7 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd60,(int64_t)in_stack_fffffffffffffd58,
                        (int64_t)in_stack_fffffffffffffd50);
    dVar4 = *pdVar7;
    pdVar7 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd60,(int64_t)in_stack_fffffffffffffd58,
                        (int64_t)in_stack_fffffffffffffd50);
    *pdVar7 = dVar1 * dVar2 + dVar3 * dVar4;
  }
  for (local_24 = 8; iVar5 = (int)((ulong)in_stack_fffffffffffffd40 >> 0x20), local_24 < 0x1b;
      local_24 = local_24 + 1) {
    TPZStack<int,_10>::TPZStack(in_stack_fffffffffffffd50);
    pztopology::TPZCube::HigherDimensionSides(iVar5,in_stack_fffffffffffffd38);
    iVar8 = TPZVec<int>::NElements(local_88);
    for (local_98 = 0; local_98 < (int)iVar8; local_98 = local_98 + 1) {
      TPZVec<int>::operator[](local_88,(long)local_98);
      pdVar7 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffd60,(int64_t)in_stack_fffffffffffffd58,
                          (int64_t)in_stack_fffffffffffffd50);
      dVar1 = *pdVar7;
      pdVar7 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffd60,(int64_t)in_stack_fffffffffffffd58,
                          (int64_t)in_stack_fffffffffffffd50);
      *pdVar7 = *pdVar7 + dVar1;
      pdVar7 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffd60,(int64_t)in_stack_fffffffffffffd58,
                          (int64_t)in_stack_fffffffffffffd50);
      dVar1 = *pdVar7;
      pdVar7 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffd60,(int64_t)in_stack_fffffffffffffd58,
                          (int64_t)in_stack_fffffffffffffd50);
      *pdVar7 = *pdVar7 + dVar1;
      pdVar7 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffd60,(int64_t)in_stack_fffffffffffffd58,
                          (int64_t)in_stack_fffffffffffffd50);
      dVar1 = *pdVar7;
      pdVar7 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffd60,(int64_t)in_stack_fffffffffffffd58,
                          (int64_t)in_stack_fffffffffffffd50);
      *pdVar7 = *pdVar7 + dVar1;
      pdVar7 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffd60,(int64_t)in_stack_fffffffffffffd58,
                          (int64_t)in_stack_fffffffffffffd50);
      dVar1 = *pdVar7;
      pdVar7 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffd60,(int64_t)in_stack_fffffffffffffd58,
                          (int64_t)in_stack_fffffffffffffd50);
      *pdVar7 = dVar1 + *pdVar7;
    }
    iVar5 = pztopology::TPZCube::SideDimension(0x1875167);
    if (iVar5 == 1) {
      local_278 = 4;
    }
    else {
      if (iVar5 == 2) {
        local_27c = 0x10;
      }
      else {
        local_27c = 0;
        if (iVar5 == 3) {
          local_27c = 0x40;
        }
      }
      local_278 = local_27c;
    }
    pdVar7 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd60,(int64_t)in_stack_fffffffffffffd58,
                        (int64_t)in_stack_fffffffffffffd50);
    *pdVar7 = *pdVar7 * (double)local_278;
    in_stack_fffffffffffffd60 = (TPZFMatrix<double> *)(double)local_278;
    pdVar7 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd60,(int64_t)in_stack_fffffffffffffd58,
                        (int64_t)in_stack_fffffffffffffd50);
    *pdVar7 = *pdVar7 * (double)in_stack_fffffffffffffd60;
    in_stack_fffffffffffffd50 = (TPZStack<int,_10> *)(double)local_278;
    in_stack_fffffffffffffd58 =
         TPZFMatrix<double>::operator()
                   (in_stack_fffffffffffffd60,(int64_t)in_stack_fffffffffffffd58,
                    (int64_t)in_stack_fffffffffffffd50);
    *in_stack_fffffffffffffd58 = *in_stack_fffffffffffffd58 * (double)in_stack_fffffffffffffd50;
    in_stack_fffffffffffffd40 = (double)local_278;
    pdVar7 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd60,(int64_t)in_stack_fffffffffffffd58,
                        (int64_t)in_stack_fffffffffffffd50);
    *pdVar7 = in_stack_fffffffffffffd40 * *pdVar7;
    TPZStack<int,_10>::~TPZStack((TPZStack<int,_10> *)0x18752f0);
  }
  return;
}

Assistant:

void TPZShapeCube::ShapeGenerating(const TPZVec<REAL> &pt, TPZVec<int> &nshape, TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &dphi)
{
    int is;
    // contribute the ribs
    for(is=8; is<20; is++)
    {
        if(nshape[is-8] == 0) continue;
        int is1,is2;
        is1 = ContainedSideLocId(is,0);
        is2 = ContainedSideLocId(is,1);
        phi(is,0) = phi(is1,0)*phi(is2,0);
        dphi(0,is) = dphi(0,is1)*phi(is2,0)+phi(is1,0)*dphi(0,is2);
        dphi(1,is) = dphi(1,is1)*phi(is2,0)+phi(is1,0)*dphi(1,is2);
        dphi(2,is) = dphi(2,is1)*phi(is2,0)+phi(is1,0)*dphi(2,is2);
    }
    // contribution of the faces
    for(is=20; is<26; is++)
    {

        int is1,is2;
        is1 = ContainedSideLocId(is,0);
        is2 = ContainedSideLocId(is,2);
        phi(is,0) = phi(is1,0)*phi(is2,0);
        dphi(0,is) = dphi(0,is1)*phi(is2,0)+phi(is1,0)*dphi(0,is2);
        dphi(1,is) = dphi(1,is1)*phi(is2,0)+phi(is1,0)*dphi(1,is2);
        dphi(2,is) = dphi(2,is1)*phi(is2,0)+phi(is1,0)*dphi(2,is2);
    }
    // contribution of the volume
    for(is=26; is<27; is++)
    {

        int is1,is2;
        is1 = 0;
        is2 = 6;
        phi(is,0) = phi(is1,0)*phi(is2,0);
        dphi(0,is) = dphi(0,is1)*phi(is2,0)+phi(is1,0)*dphi(0,is2);
        dphi(1,is) = dphi(1,is1)*phi(is2,0)+phi(is1,0)*dphi(1,is2);
        dphi(2,is) = dphi(2,is1)*phi(is2,0)+phi(is1,0)*dphi(2,is2);
    }

    // Make the generating shape functions linear and unitary
    for(is=8; is<27; is++)
    {
        TPZStack<int> highsides;
        HigherDimensionSides(is,highsides);
        int h, nh = highsides.NElements();
        for(h=0; h<nh; h++)
        {
            int hs = highsides[h];
            phi(is,0) += phi(hs,0);
            dphi(0,is) += dphi(0,hs);
            dphi(1,is) += dphi(1,hs);
            dphi(2,is) += dphi(2,hs);
        }
        int dim = SideDimension(is);
        int mult = (dim == 1) ? 4 : (dim == 2) ? 16 : (dim ==3) ? 64 : 0;
        phi(is,0) *= mult;
        dphi(0,is) *= mult;
        dphi(1,is) *= mult;
        dphi(2,is) *= mult;
    }

}